

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

TCGArg do_constant_folding_cond2(TCGArg *p1,TCGArg *p2,TCGCond c)

{
  TCGTemp *ts1;
  TCGTemp *ts1_00;
  TCGTemp *ts2;
  TCGTemp *ts2_00;
  char *pcVar1;
  char *pcVar2;
  _Bool _Var3;
  uint64_t y;
  uint64_t x;
  
  ts1 = (TCGTemp *)*p1;
  ts1_00 = (TCGTemp *)p1[1];
  ts2 = (TCGTemp *)*p2;
  ts2_00 = (TCGTemp *)p2[1];
  pcVar1 = (char *)ts2->state_ptr;
  if ((*pcVar1 == '\x01') && (pcVar2 = (char *)ts2_00->state_ptr, *pcVar2 == '\x01')) {
    y = deposit64(*(uint64_t *)(pcVar1 + 0x18),0x20,0x20,*(uint64_t *)(pcVar2 + 0x18));
    pcVar1 = (char *)ts1->state_ptr;
    if ((*pcVar1 == '\x01') && (pcVar2 = (char *)ts1_00->state_ptr, *pcVar2 == '\x01')) {
      x = deposit64(*(uint64_t *)(pcVar1 + 0x18),0x20,0x20,*(uint64_t *)(pcVar2 + 0x18));
      _Var3 = do_constant_folding_cond_64(x,y,c);
      goto LAB_00b59380;
    }
    if (y == 0) {
      if (c == TCG_COND_LTU) {
        return 0;
      }
      if (c == TCG_COND_GEU) {
        return 1;
      }
    }
  }
  _Var3 = ts_are_copies(ts1,ts2);
  if (!_Var3) {
    return 2;
  }
  _Var3 = ts_are_copies(ts1_00,ts2_00);
  if (!_Var3) {
    return 2;
  }
  _Var3 = do_constant_folding_cond_eq(c);
LAB_00b59380:
  return (ulong)_Var3;
}

Assistant:

static TCGArg do_constant_folding_cond2(TCGArg *p1, TCGArg *p2, TCGCond c)
{
    TCGArg al = p1[0], ah = p1[1];
    TCGArg bl = p2[0], bh = p2[1];

    if (arg_is_const(bl) && arg_is_const(bh)) {
        tcg_target_ulong blv = arg_info(bl)->val;
        tcg_target_ulong bhv = arg_info(bh)->val;
        uint64_t b = deposit64(blv, 32, 32, bhv);

        if (arg_is_const(al) && arg_is_const(ah)) {
            tcg_target_ulong alv = arg_info(al)->val;
            tcg_target_ulong ahv = arg_info(ah)->val;
            uint64_t a = deposit64(alv, 32, 32, ahv);
            return do_constant_folding_cond_64(a, b, c);
        }
        if (b == 0) {
            switch (c) {
            case TCG_COND_LTU:
                return 0;
            case TCG_COND_GEU:
                return 1;
            default:
                break;
            }
        }
    }
    if (args_are_copies(al, bl) && args_are_copies(ah, bh)) {
        return do_constant_folding_cond_eq(c);
    }
    return 2;
}